

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

bool __thiscall Minisat::Int64Option::parse(Int64Option *this,char *str)

{
  bool bVar1;
  longlong lVar2;
  char *in_RSI;
  long in_RDI;
  int64_t tmp;
  char *end;
  char *span;
  char *local_28;
  char *local_20 [3];
  bool local_1;
  
  local_20[0] = in_RSI;
  bVar1 = match<char_const*>(local_20,"-");
  if (((bVar1) && (bVar1 = match<char_const*>(local_20,*(char **)(in_RDI + 8)), bVar1)) &&
     (bVar1 = match<char_const*>(local_20,"="), bVar1)) {
    lVar2 = strtoll(local_20[0],&local_28,10);
    if (local_28 == (char *)0x0) {
      local_1 = false;
    }
    else {
      if (*(long *)(in_RDI + 0x38) < lVar2) {
        fprintf(_stderr,"ERROR! value <%s> is too large for option \"%s\".\n",local_20[0],
                *(undefined8 *)(in_RDI + 8));
        exit(1);
      }
      if (lVar2 < *(long *)(in_RDI + 0x30)) {
        fprintf(_stderr,"ERROR! value <%s> is too small for option \"%s\".\n",local_20[0],
                *(undefined8 *)(in_RDI + 8));
        exit(1);
      }
      *(longlong *)(in_RDI + 0x40) = lVar2;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

virtual bool parse(const char *str)
    {
        const char *span = str;

        if (!match(span, "-") || !match(span, name) || !match(span, "=")) return false;

        char *end;
        int64_t tmp = strtoll(span, &end, 10);

        if (end == NULL)
            return false;
        else if (tmp > range.end) {
            fprintf(stderr, "ERROR! value <%s> is too large for option \"%s\".\n", span, name);
            exit(1);
        } else if (tmp < range.begin) {
            fprintf(stderr, "ERROR! value <%s> is too small for option \"%s\".\n", span, name);
            exit(1);
        }

        value = tmp;

        return true;
    }